

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleTargetMode(cmSetPropertyCommand *this)

{
  bool bVar1;
  cmTarget *target_00;
  ostream *poVar2;
  string local_210;
  ostringstream local_1f0 [8];
  ostringstream e;
  cmTarget *target;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmSetPropertyCommand *this_local;
  
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Names);
  name = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&name);
    if (!bVar1) {
      return true;
    }
    local_38 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,local_38);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"can not be used on an ALIAS target.",&local_59);
      cmCommand::SetError(&this->super_cmCommand,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      return false;
    }
    target_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,local_38,false);
    if (target_00 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1f0);
      poVar2 = std::operator<<((ostream *)local_1f0,"could not find TARGET ");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      std::operator<<(poVar2,".  Perhaps it has not yet been created.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream(local_1f0);
      return false;
    }
    bVar1 = HandleTarget(this,target_00);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleTargetMode()
{
  for (std::string const& name : this->Names) {
    if (this->Makefile->IsAlias(name)) {
      this->SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = this->Makefile->FindTargetToUse(name)) {
      // Handle the current target.
      if (!this->HandleTarget(target)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find TARGET " << name
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}